

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

ssize_t __thiscall VectorWriter::write(VectorWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  size_t __n_00;
  uchar *puVar2;
  size_type sVar3;
  const_iterator __position;
  unsigned_long *puVar4;
  byte *__src;
  size_t sVar5;
  long in_FS_OFFSET;
  size_t nOverwrite;
  Span<const_std::byte> *in_stack_ffffffffffffff78;
  unsigned_long *in_stack_ffffffffffffff80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *in_stack_ffffffffffffff88;
  uchar *__first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __first = (uchar *)this->nPos;
  puVar2 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               in_stack_ffffffffffffff78);
  if (puVar2 < __first) {
    __assert_fail("nPos <= vchData.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/streams.h"
                  ,0x4c,"void VectorWriter::write(Span<const std::byte>)");
  }
  Span<const_std::byte>::size(in_stack_ffffffffffffff78);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff78);
  __position._M_current = (uchar *)(sVar3 - this->nPos);
  puVar4 = std::min<unsigned_long>
                     (in_stack_ffffffffffffff80,(unsigned_long *)in_stack_ffffffffffffff78);
  __n_00 = *puVar4;
  if (__n_00 != 0) {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_ffffffffffffff78);
    sVar5 = this->nPos;
    __src = Span<const_std::byte>::data(in_stack_ffffffffffffff78);
    memcpy(puVar2 + sVar5,__src,__n_00);
  }
  sVar5 = Span<const_std::byte>::size(in_stack_ffffffffffffff78);
  if (__n_00 < sVar5) {
    this_00 = this->vchData;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this_00);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              (in_stack_ffffffffffffff88,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)this_00);
    Span<const_std::byte>::data(in_stack_ffffffffffffff78);
    UCharCast((byte *)in_stack_ffffffffffffff78);
    Span<const_std::byte>::end(in_stack_ffffffffffffff78);
    UCharCast((byte *)in_stack_ffffffffffffff78);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (in_stack_ffffffffffffffb0,__position,__first,(uchar *)this);
  }
  sVar5 = Span<const_std::byte>::size(in_stack_ffffffffffffff78);
  this->nPos = this->nPos + sVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void write(Span<const std::byte> src)
    {
        assert(nPos <= vchData.size());
        size_t nOverwrite = std::min(src.size(), vchData.size() - nPos);
        if (nOverwrite) {
            memcpy(vchData.data() + nPos, src.data(), nOverwrite);
        }
        if (nOverwrite < src.size()) {
            vchData.insert(vchData.end(), UCharCast(src.data()) + nOverwrite, UCharCast(src.end()));
        }
        nPos += src.size();
    }